

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O1

void rt_Translate4cols(BYTE *translation,int yl,int yh)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  
  uVar1 = (yh - yl) + 1;
  pbVar3 = dc_temp + (yl << 2);
  if (1 < uVar1) {
    iVar4 = (int)uVar1 >> 1;
    do {
      bVar2 = translation[pbVar3[1]];
      *pbVar3 = translation[*pbVar3];
      pbVar3[1] = bVar2;
      bVar2 = translation[pbVar3[3]];
      pbVar3[2] = translation[pbVar3[2]];
      pbVar3[3] = bVar2;
      bVar2 = translation[pbVar3[5]];
      pbVar3[4] = translation[pbVar3[4]];
      pbVar3[5] = bVar2;
      bVar2 = translation[pbVar3[7]];
      pbVar3[6] = translation[pbVar3[6]];
      pbVar3[7] = bVar2;
      pbVar3 = pbVar3 + 8;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if ((yh - yl & 1U) == 0) {
    bVar2 = translation[pbVar3[1]];
    *pbVar3 = translation[*pbVar3];
    pbVar3[1] = bVar2;
    bVar2 = translation[pbVar3[3]];
    pbVar3[2] = translation[pbVar3[2]];
    pbVar3[3] = bVar2;
  }
  return;
}

Assistant:

void rt_Translate4cols(const BYTE *translation, int yl, int yh)
{
	int count = yh - yl + 1;
	BYTE *source = &dc_temp[yl*4];
	int c0, c1;
	BYTE b0, b1;

	// Do 2 rows at a time.
	for (int count8 = count >> 1; count8; --count8)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;

		c0 = source[4];			c1 = source[5];
		b0 = translation[c0];	b1 = translation[c1];
		source[4] = b0;			source[5] = b1;

		c0 = source[6];			c1 = source[7];
		b0 = translation[c0];	b1 = translation[c1];
		source[6] = b0;			source[7] = b1;

		source += 8;
	}
	// Do the final row if count was odd.
	if (count & 1)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;
	}
}